

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_miniz.cpp
# Opt level: O0

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive *pZip,void **pBuf,size_t *pSize)

{
  mz_bool mVar1;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  mz_bool local_4;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x58) == 0)) || (in_RSI == (undefined8 *)0x0)) ||
     (in_RDX == (undefined8 *)0x0)) {
    local_4 = 0;
  }
  else if (*(code **)(in_RDI + 0x48) == mz_zip_heap_write_func) {
    mVar1 = mz_zip_writer_finalize_archive((mz_zip_archive *)pSize);
    if (mVar1 == 0) {
      local_4 = 0;
    }
    else {
      *in_RSI = *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x68);
      *in_RDX = *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x70);
      *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x68) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x78) = 0;
      *(undefined8 *)(*(long *)(in_RDI + 0x58) + 0x70) = 0;
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

mz_bool mz_zip_writer_finalize_heap_archive(mz_zip_archive* pZip, void** pBuf, size_t* pSize) {
  if ((!pZip) || (!pZip->m_pState) || (!pBuf) || (!pSize))
    return MZ_FALSE;
  if (pZip->m_pWrite != mz_zip_heap_write_func)
    return MZ_FALSE;
  if (!mz_zip_writer_finalize_archive(pZip))
    return MZ_FALSE;

  *pBuf = pZip->m_pState->m_pMem;
  *pSize = pZip->m_pState->m_mem_size;
  pZip->m_pState->m_pMem = NULL;
  pZip->m_pState->m_mem_size = pZip->m_pState->m_mem_capacity = 0;
  return MZ_TRUE;
}